

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O0

void Map_MappingEstimateRefsInit(Map_Man_t *p)

{
  Map_Node_t *pMVar1;
  float fVar2;
  int local_1c;
  int i;
  Map_Node_t *pNode;
  Map_Man_t *p_local;
  
  for (local_1c = 0; local_1c < p->vMapObjs->nSize; local_1c = local_1c + 1) {
    pMVar1 = p->vMapObjs->pArray[local_1c];
    fVar2 = (float)pMVar1->nRefs;
    pMVar1->nRefEst[2] = fVar2;
    pMVar1->nRefEst[1] = fVar2;
    pMVar1->nRefEst[0] = fVar2;
  }
  return;
}

Assistant:

void Map_MappingEstimateRefsInit( Map_Man_t * p )
{
    Map_Node_t * pNode;
    int i;
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
//        pNode->nRefEst[0] = pNode->nRefEst[1] = ((float)pNode->nRefs)*(float)2.0;
        pNode->nRefEst[0] = pNode->nRefEst[1] = pNode->nRefEst[2] = ((float)pNode->nRefs);
    }
}